

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

target_ulong helper_cmpb_ppc64(target_ulong rs,target_ulong rb)

{
  target_ulong tVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = 0xff;
  iVar3 = 8;
  tVar1 = 0;
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    uVar4 = 0;
    if ((uVar2 & (rs ^ rb)) == 0) {
      uVar4 = uVar2;
    }
    tVar1 = tVar1 | uVar4;
    uVar2 = uVar2 << 8;
  }
  return tVar1;
}

Assistant:

target_ulong helper_cmpb(target_ulong rs, target_ulong rb)
{
    target_ulong mask = 0xff;
    target_ulong ra = 0;
    int i;

    for (i = 0; i < sizeof(target_ulong); i++) {
        if ((rs & mask) == (rb & mask)) {
            ra |= mask;
        }
        mask <<= 8;
    }
    return ra;
}